

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_TIMED_INC_NO_RES(effect_handler_context_t_conflict *context)

{
  byte can_disturb;
  wchar_t wVar1;
  wchar_t v;
  
  wVar1 = effect_calculate_value(context,false);
  if ((player->timed[context->subtype] == 0) || (v = context->other, v == L'\0')) {
    v = L'\0';
    if (L'\0' < wVar1) {
      v = wVar1;
    }
    can_disturb = true;
    if ((context->origin).what == SRC_PLAYER) {
      can_disturb = context->aware ^ 1;
    }
  }
  else {
    can_disturb = true;
    if ((context->origin).what == SRC_PLAYER) {
      can_disturb = context->aware ^ 1;
    }
  }
  player_inc_timed(player,context->subtype,v,true,(_Bool)can_disturb,false);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_TIMED_INC_NO_RES(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);

	if (!player->timed[context->subtype] || !context->other)
		player_inc_timed(player, context->subtype, MAX(amount, 0),
			true,
			context->origin.what != SRC_PLAYER || !context->aware,
			false);
	else
		player_inc_timed(player, context->subtype, context->other, true,
			context->origin.what != SRC_PLAYER || !context->aware,
			false);
	context->ident = true;
	return true;
}